

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::erase
          (Question *__return_storage_ptr__,
          ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id,Question *entry)

{
  bool bVar1;
  Entry **ppEVar2;
  Question *pQVar3;
  Question local_108;
  undefined1 local_d9;
  Fault local_d8;
  Fault f;
  Entry *local_c8;
  Question *local_c0;
  undefined1 local_b8 [8];
  DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*>
  _kjCondition;
  Question local_88;
  Entry *local_60;
  Fault local_48;
  Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry_&>
  local_40;
  Entry *local_38;
  Entry *_kj_result;
  Entry *slot;
  Question *entry_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *pEStack_18;
  uint id_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this_local;
  Question *toRelease;
  
  slot = (Entry *)entry;
  entry_local._4_4_ = id;
  pEStack_18 = this;
  this_local = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *)
               __return_storage_ptr__;
  bVar1 = isHigh(this,(uint *)((long)&entry_local + 4));
  if (bVar1) {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::
    findEntry<unsigned_int&>
              ((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question> *)
               &local_40,(uint *)&this->highSlots);
    local_38 = kj::_::
               readMaybe<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
                         (&local_40);
    if (local_38 == (Entry *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xed,FAILED,"highSlots.findEntry(id) != nullptr","");
      kj::_::Debug::Fault::fatal(&local_48);
    }
    ppEVar2 = kj::
              mv<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry*>
                        (&local_38);
    local_60 = *ppEVar2;
    _kj_result = local_60;
    kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::release
              ((Entry *)&_kjCondition.result,&this->highSlots,local_60);
    RpcSystemBase::RpcConnectionState::Question::Question(__return_storage_ptr__,&local_88);
    kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry::~Entry
              ((Entry *)&_kjCondition.result);
  }
  else {
    local_c8 = slot;
    local_c0 = (Question *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Question **)&local_c8);
    f.exception = (Exception *)
                  kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator[]
                            (&this->slots,(ulong)entry_local._4_4_);
    kj::_::DebugExpression<capnp::_::RpcSystemBase::RpcConnectionState::Question*>::operator==
              ((DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*>
                *)local_b8,
               (DebugExpression<capnp::_::RpcSystemBase::RpcConnectionState::Question*> *)&local_c0,
               (Question **)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Question*,capnp::_::RpcSystemBase::RpcConnectionState::Question*>&>
                (&local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xf0,FAILED,"&entry == &slots[id]","_kjCondition,",
                 (DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*>
                  *)local_b8);
      kj::_::Debug::Fault::fatal(&local_d8);
    }
    local_d9 = 0;
    pQVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator[]
                       (&this->slots,(ulong)entry_local._4_4_);
    pQVar3 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Question>(pQVar3);
    RpcSystemBase::RpcConnectionState::Question::Question(__return_storage_ptr__,pQVar3);
    local_108.paramExports.disposer = (ArrayDisposer *)0x0;
    local_108.selfRef.ptr = (QuestionRef *)0x0;
    local_108.paramExports.ptr = (uint *)0x0;
    local_108.paramExports.size_ = 0;
    local_108.isAwaitingReturn = false;
    local_108.isTailCall = false;
    local_108.skipFinish = false;
    local_108._35_5_ = 0;
    RpcSystemBase::RpcConnectionState::Question::Question(&local_108);
    pQVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator[]
                       (&this->slots,(ulong)entry_local._4_4_);
    RpcSystemBase::RpcConnectionState::Question::operator=(pQVar3,&local_108);
    RpcSystemBase::RpcConnectionState::Question::~Question(&local_108);
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::push(&this->freeIds,(value_type *)((long)&entry_local + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(Id id, T& entry) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    // `entry` is a reference to the entry being released -- we require this in order to prove
    // that the caller has already done a find() to check that this entry exists.  We can't check
    // ourselves because the caller may have nullified the entry in the meantime.

    if (isHigh(id)) {
      auto& slot = KJ_REQUIRE_NONNULL(highSlots.findEntry(id));
      return highSlots.release(slot).value;
    } else {
      KJ_DREQUIRE(&entry == &slots[id]);
      T toRelease = kj::mv(slots[id]);
      slots[id] = T();
      freeIds.push(id);
      return toRelease;
    }
  }